

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utglTF2ImportExport.cpp
# Opt level: O1

void __thiscall
utglTF2ImportExport_importglTF2PrimitiveModeTrianglesFanWithoutIndices_Test::
~utglTF2ImportExport_importglTF2PrimitiveModeTrianglesFanWithoutIndices_Test
          (utglTF2ImportExport_importglTF2PrimitiveModeTrianglesFanWithoutIndices_Test *this)

{
  AbstractImportExportBase::~AbstractImportExportBase((AbstractImportExportBase *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utglTF2ImportExport, importglTF2PrimitiveModeTrianglesFanWithoutIndices) {
    Assimp::Importer importer;
    //Triangles fan without indices
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_05.gltf", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);
    EXPECT_EQ(scene->mMeshes[0]->mNumFaces, 2u);
    EXPECT_EQ(scene->mMeshes[0]->mNumVertices, 4u);
    std::array<unsigned int, 3> f1 = {{ 0u, 1u, 2u }};
    EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mNumIndices, 3u);
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mIndices[i], f1[i]);
    }

    std::array<unsigned int, 3> f2 = {{ 0u, 2u, 3u }};
    EXPECT_EQ(scene->mMeshes[0]->mFaces[1].mNumIndices, 3u);
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[1].mIndices[i], f2[i]);
    }
}